

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O0

string * __thiscall FileWriter::buildPath(FileWriter *this,string *path)

{
  bool bVar1;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  __lhs = in_RDI;
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffff98);
  if (bVar1) {
    std::__cxx11::string::string((string *)in_RDI,in_RDX);
  }
  else {
    std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    std::operator+(__lhs,in_RDI);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  return __lhs;
}

Assistant:

std::string FileWriter::buildPath(const std::string& path) {
  if (prefix_ == ".") {
    return path;
  }
  return prefix_ + "/" + path;
}